

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O3

bool __thiscall
QPageLayout::setTopMargin(QPageLayout *this,qreal topMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  QPageLayoutPrivate *pQVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pQVar1 = (this->d).d.ptr;
  if (outOfBoundsPolicy == Clamp && pQVar1->m_mode == StandardMode) {
    dVar6 = (pQVar1->m_maxMargins).m_top;
    if (topMargin <= dVar6) {
      dVar6 = topMargin;
    }
    dVar8 = (pQVar1->m_minMargins).m_top;
    topMargin = dVar6;
    if (dVar6 <= dVar8) {
      topMargin = dVar8;
    }
  }
  dVar6 = (pQVar1->m_margins).m_top;
  dVar7 = topMargin - dVar6;
  uVar3 = -(ulong)(dVar7 < -dVar7);
  uVar4 = -(ulong)(topMargin < -topMargin);
  uVar5 = -(ulong)(dVar6 < -dVar6);
  dVar8 = (double)(~uVar4 & (ulong)topMargin | (ulong)-topMargin & uVar4);
  dVar6 = (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5);
  if (dVar6 <= dVar8) {
    dVar8 = dVar6;
  }
  bVar2 = true;
  if (dVar8 < (double)(~uVar3 & (ulong)dVar7 | (ulong)-dVar7 & uVar3) * 1000000000000.0) {
    if ((pQVar1->m_mode == FullPageMode) ||
       (((pQVar1->m_minMargins).m_top <= topMargin && (topMargin <= (pQVar1->m_maxMargins).m_top))))
    {
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
        pQVar1 = (this->d).d.ptr;
      }
      (pQVar1->m_margins).m_top = topMargin;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool QPageLayout::setTopMargin(qreal topMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        topMargin = qBound(d->m_minMargins.top(), topMargin, d->m_maxMargins.top());

    if (qFuzzyCompare(topMargin, d->m_margins.top()))
        return true;

    if (d->m_mode == FullPageMode
        || (topMargin >= d->m_minMargins.top() && topMargin <= d->m_maxMargins.top())) {
        d.detach();
        d->m_margins.setTop(topMargin);
        return true;
    }

    return false;
}